

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QXdgDesktopPortalFileDialog::Filter>::Inserter::insert
          (Inserter *this,qsizetype pos,Filter *t,qsizetype n)

{
  Filter *pFVar1;
  qsizetype i;
  long lVar2;
  long lVar3;
  
  setup(this,pos,n);
  lVar3 = 0;
  for (lVar2 = 0; lVar2 != this->sourceCopyConstruct; lVar2 = lVar2 + 1) {
    QXdgDesktopPortalFileDialog::Filter::Filter((Filter *)((long)&(this->end->name).d.d + lVar3),t);
    this->size = this->size + 1;
    lVar3 = lVar3 + 0x30;
  }
  for (; lVar2 != this->nSource; lVar2 = lVar2 + 1) {
    pFVar1 = (Filter *)((long)&(this->end->name).d.d + lVar3);
    QXdgDesktopPortalFileDialog::Filter::Filter(pFVar1,pFVar1 + -this->nSource);
    this->size = this->size + 1;
    lVar3 = lVar3 + 0x30;
  }
  lVar3 = 0;
  for (lVar2 = 0; lVar2 != this->move; lVar2 = lVar2 + -1) {
    pFVar1 = (Filter *)((long)&(this->last->name).d.d + lVar3);
    QXdgDesktopPortalFileDialog::Filter::operator=(pFVar1,pFVar1 + -this->nSource);
    lVar3 = lVar3 + -0x30;
  }
  lVar3 = 0;
  for (lVar2 = 0; lVar2 != this->sourceCopyAssign; lVar2 = lVar2 + 1) {
    QXdgDesktopPortalFileDialog::Filter::operator=
              ((Filter *)((long)&(this->where->name).d.d + lVar3),t);
    lVar3 = lVar3 + 0x30;
  }
  return;
}

Assistant:

void insert(qsizetype pos, const T &t, qsizetype n)
        {
            const qsizetype oldSize = size;
            Q_UNUSED(oldSize);

            setup(pos, n);

            // first create new elements at the end, by copying from elements
            // to be inserted (if they extend past the current end of the array)
            for (qsizetype i = 0; i != sourceCopyConstruct; ++i) {
                new (end + i) T(t);
                ++size;
            }
            Q_ASSERT(size <= oldSize + n);

            // now move construct new elements at the end from existing elements inside
            // the array.
            for (qsizetype i = sourceCopyConstruct; i != nSource; ++i) {
                new (end + i) T(std::move(*(end + i - nSource)));
                ++size;
            }
            // array has the new size now!
            Q_ASSERT(size == oldSize + n);

            // now move assign existing elements towards the end
            for (qsizetype i = 0; i != move; --i)
                last[i] = std::move(last[i - nSource]);

            // finally copy the remaining elements from source over
            for (qsizetype i = 0; i != sourceCopyAssign; ++i)
                where[i] = t;
        }